

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O0

void setTTYCursor(bool enable)

{
  int iVar1;
  char *__s;
  byte in_DIL;
  long in_FS_OFFSET;
  char *termctl;
  char **dev;
  int fd;
  char *devs [4];
  mode_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *pcVar2;
  char **local_38;
  char *local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((setTTYCursor(bool)::ignore == '\0') &&
     (iVar1 = __cxa_guard_acquire(&setTTYCursor(bool)::ignore), iVar1 != 0)) {
    iVar1 = qEnvironmentVariableIntValue("QT_QPA_PRESERVE_CONSOLE_STATE",(bool *)0x0);
    setTTYCursor::ignore = iVar1 != 0;
    __cxa_guard_release(&setTTYCursor(bool)::ignore);
  }
  if ((setTTYCursor::ignore & 1U) == 0) {
    local_28 = "/dev/tty0";
    local_20 = "/dev/tty";
    local_18 = "/dev/console";
    local_10 = 0;
    for (local_38 = &local_28; *local_38 != (char *)0x0; local_38 = local_38 + 1) {
      iVar1 = qt_safe_open((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      if (iVar1 != -1) {
        __s = "\x1b[9;0]\x1b[?33l\x1b[?25l\x1b[?1c";
        if ((in_DIL & 1) != 0) {
          __s = "\x1b[9;15]\x1b[?33h\x1b[?25h\x1b[?0c";
        }
        pcVar2 = __s;
        strlen(__s);
        qt_safe_write((int)((ulong)pcVar2 >> 0x20),__s,CONCAT44(iVar1,in_stack_ffffffffffffffb0));
        qt_safe_close(iVar1);
        break;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void setTTYCursor(bool enable)
{
    static bool ignore = qEnvironmentVariableIntValue("QT_QPA_PRESERVE_CONSOLE_STATE");
    if (ignore)
        return;

    const char * const devs[] = { "/dev/tty0", "/dev/tty", "/dev/console", 0 };
    int fd = -1;
    for (const char * const *dev = devs; *dev; ++dev) {
        fd = QT_OPEN(*dev, O_RDWR);
        if (fd != -1) {
            // Enable/disable screen blanking and the blinking cursor.
            const char *termctl = enable ? "\033[9;15]\033[?33h\033[?25h\033[?0c" : "\033[9;0]\033[?33l\033[?25l\033[?1c";
            QT_WRITE(fd, termctl, strlen(termctl) + 1);
            QT_CLOSE(fd);
            return;
        }
    }
}